

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O3

void __thiscall Nonogram::step(Nonogram *this)

{
  Line *pLVar1;
  pointer pLVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  Known local_218;
  Known local_1c8;
  Known local_170;
  Known local_120;
  Known local_d0;
  Known local_80;
  
  local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._12_4_ = 0;
  local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._12_4_ = 0;
  local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._12_4_ = 0;
  local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._12_4_ = 0;
  uVar4 = this->m_referred_number;
  uVar5 = (ulong)uVar4;
  if (uVar4 < (uint)(this->m_y + this->m_x)) {
    lVar6 = uVar5 * 0x48;
    do {
      pLVar2 = (this->m_lines).super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
               super__Vector_impl_data._M_start;
      pLVar1 = (Line *)((long)&(pLVar2->m_options).
                               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                               ._M_impl + lVar6);
      uVar4 = *(uint *)((long)&pLVar2->m_index + lVar6);
      if ((&pLVar2->m_direction)[lVar6] == HORIZONTAL) {
        bVar3 = horizontal_changed(this,uVar4,-2,-1);
        if (bVar3) {
          get_horizontal(&local_120,this,pLVar1->m_index);
          Line::calculate_known(&local_218,pLVar1,&local_120);
          set_horizontal(this,&local_218,pLVar1->m_index);
          if (local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_218.second.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_end_of_storage -
                            (long)local_218.second.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                  ._M_p);
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (local_120.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_120.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_120.second.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_end_of_storage -
                            (long)local_120.second.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                  ._M_p);
            local_120.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_120.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_120.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_120.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_120.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (local_120.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_120.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_120.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)local_120.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_120.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_120.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_120.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_120.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_120.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
        }
      }
      else {
        bVar3 = vertical_changed(this,uVar4,-2,-1);
        if (bVar3) {
          get_vertical(&local_170,this,pLVar1->m_index);
          Line::calculate_known(&local_218,pLVar1,&local_170);
          set_vertical(this,&local_218,pLVar1->m_index);
          if (local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_218.second.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_end_of_storage -
                            (long)local_218.second.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                  ._M_p);
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (local_170.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_170.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_170.second.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_end_of_storage -
                            (long)local_170.second.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                  ._M_p);
            local_170.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_170.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_170.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_170.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_170.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (local_170.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_170.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_170.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)local_170.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_170.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_170.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_170.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_170.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_170.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x48;
    } while (uVar5 < (uint)(this->m_y + this->m_x));
    uVar4 = this->m_referred_number;
  }
  if (uVar4 != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pLVar2 = (this->m_lines).super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
               super__Vector_impl_data._M_start;
      pLVar1 = (Line *)((long)&(pLVar2->m_options).
                               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                               ._M_impl + lVar6);
      uVar4 = *(uint *)((long)&pLVar2->m_index + lVar6);
      if ((&pLVar2->m_direction)[lVar6] == HORIZONTAL) {
        bVar3 = horizontal_changed(this,uVar4,-2,-1);
        if (bVar3) {
          get_horizontal(&local_218,this,pLVar1->m_index);
          Line::filter(pLVar1,&local_218);
          goto LAB_0010b0b9;
        }
      }
      else {
        bVar3 = vertical_changed(this,uVar4,-2,-1);
        if (bVar3) {
          get_vertical(&local_218,this,pLVar1->m_index);
          Line::filter(pLVar1,&local_218);
LAB_0010b0b9:
          if (local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_218.second.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_end_of_storage -
                            (long)local_218.second.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                  ._M_p);
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          }
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x48;
    } while (uVar5 < this->m_referred_number);
    if (this->m_referred_number != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        pLVar2 = (this->m_lines).super__Vector_base<Line,_std::allocator<Line>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pLVar1 = (Line *)((long)&(pLVar2->m_options).
                                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                 ._M_impl + lVar6);
        uVar4 = *(uint *)((long)&pLVar2->m_index + lVar6);
        if ((&pLVar2->m_direction)[lVar6] == HORIZONTAL) {
          bVar3 = horizontal_changed(this,uVar4,-2,-1);
          if (bVar3) {
            get_horizontal(&local_80,this,pLVar1->m_index);
            Line::merge_options(&local_218,pLVar1,&local_80);
            if (local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_1c8.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage -
                              (long)local_1c8.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
            }
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            if (local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_1c8.second.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage -
                              (long)local_1c8.second.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
            }
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            if (local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_218.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage -
                              (long)local_218.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
              local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
              local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            }
            if (local_80.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_80.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_80.second.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage -
                              (long)local_80.second.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
              local_80.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_80.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
              local_80.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_80.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              local_80.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            }
            if (local_80.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_80.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_80.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage -
                              (long)local_80.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
              local_80.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_80.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
              local_80.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_80.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              local_80.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            }
            set_horizontal(this,&local_1c8,pLVar1->m_index);
          }
        }
        else {
          bVar3 = vertical_changed(this,uVar4,-2,-1);
          if (bVar3) {
            get_vertical(&local_d0,this,pLVar1->m_index);
            Line::merge_options(&local_218,pLVar1,&local_d0);
            if (local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_1c8.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage -
                              (long)local_1c8.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
            }
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
            local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                 local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            if (local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_1c8.second.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage -
                              (long)local_1c8.second.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
            }
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
            local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                 local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_218.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            if (local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_218.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage -
                              (long)local_218.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
              local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
              local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              local_218.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            }
            if (local_d0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_d0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_d0.second.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage -
                              (long)local_d0.second.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
              local_d0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_d0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
              local_d0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_d0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              local_d0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            }
            if (local_d0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_d0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_d0.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage -
                              (long)local_d0.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
              local_d0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_d0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
              local_d0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_d0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              local_d0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            }
            set_vertical(this,&local_1c8,pLVar1->m_index);
          }
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x48;
      } while (uVar5 < this->m_referred_number);
      if (local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_1c8.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
    }
  }
  if (local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1c8.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Nonogram::step() {
    Known known;

    // Extract known values from lines that are not yet resolved, and set them in the board.
    for (unsigned int i = m_referred_number; i < m_x + m_y; i++) {
        auto &line = m_lines[i];
        if (line.m_direction == HORIZONTAL) {
            if (horizontal_changed(line.m_index)) {
                set_horizontal(line.calculate_known(get_horizontal(line.m_index)), line.m_index);
            }
        } else if (vertical_changed(line.m_index)) {
            set_vertical(line.calculate_known(get_vertical(line.m_index)), line.m_index);
        }
    }

    // Filter the resolved lines options by what is already known of the line.
    for (unsigned int i = 0; i < m_referred_number; i++) {
        auto &line = m_lines[i];
        if (line.m_direction == HORIZONTAL) {
            if (horizontal_changed(line.m_index)) {
                line.filter(get_horizontal(line.m_index));
            }
        } else if (vertical_changed(line.m_index)) {
            line.filter(get_vertical(line.m_index));
        }
    }

    // Extract known values from resolved lines, and set them in the board.
    for (unsigned int i = 0; i < m_referred_number; i++) {
        auto &line = m_lines[i];
        if (line.m_direction == HORIZONTAL) {
            if (horizontal_changed(line.m_index)) {
                known = line.merge_options(get_horizontal(line.m_index));
                set_horizontal(known, line.m_index);
            }
        } else if (vertical_changed(line.m_index)) {
            known = line.merge_options(get_vertical(line.m_index));
            set_vertical(known, line.m_index);
        }
    }
}